

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3map_io.c
# Opt level: O0

int s3map_write(char *fn,void *map,uint32 n_dom,uint32 n_rng,size_t map_elem_size)

{
  int32 iVar1;
  int iVar2;
  uint32 local_40 [2];
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  size_t map_elem_size_local;
  uint32 n_rng_local;
  uint32 n_dom_local;
  void *map_local;
  char *fn_local;
  
  local_40[1] = 0;
  local_40[0] = 0;
  fp = (FILE *)map_elem_size;
  map_elem_size_local._0_4_ = n_rng;
  map_elem_size_local._4_4_ = n_dom;
  _n_rng_local = map;
  map_local = fn;
  s3clr_fattr();
  s3add_fattr("version","1.2",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)map_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    iVar1 = bio_fwrite(&map_elem_size_local,4,1,_ignore,0,local_40 + 1);
    if (iVar1 == 1) {
      iVar2 = bio_fwrite_1d(_n_rng_local,(size_t)fp,map_elem_size_local._4_4_,_ignore,local_40 + 1);
      if (iVar2 < 0) {
        s3close(_ignore);
        fn_local._4_4_ = -1;
      }
      else {
        iVar1 = bio_fwrite(local_40 + 1,4,1,_ignore,0,local_40);
        if (iVar1 == 1) {
          s3close(_ignore);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
                  ,0xaa,"Wrote %s [%u mappings to %u]\n",map_local,(ulong)map_elem_size_local._4_4_,
                  (uint32)map_elem_size_local);
          fn_local._4_4_ = 0;
        }
        else {
          s3close(_ignore);
          fn_local._4_4_ = -1;
        }
      }
    }
    else {
      s3close(_ignore);
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3map_write(const char *fn,
	    void *map,
	    uint32 n_dom,
	    uint32 n_rng,
	    size_t map_elem_size)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", MAP_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite(&n_rng, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    if (bio_fwrite_1d(map,
		   map_elem_size,
		   n_dom,
		   fp,
		   &chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%u mappings to %u]\n", fn, n_dom, n_rng);

    return S3_SUCCESS;
}